

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O1

void __thiscall KDReports::Test::testEvenOdd(Test *this)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  bool bVar8;
  Report report;
  long local_38;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  pvVar2 = (void *)KDReports::Report::header(&report,2);
  pvVar3 = (void *)KDReports::Report::header(&report,4);
  if (*(long *)(local_38 + 0x78) == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = *(long *)(*(long *)(local_38 + 0x78) + 0x30) != 0;
  }
  cVar1 = QTest::qVerify(bVar8,"!headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x34);
  if (cVar1 != '\0') {
    iVar7 = (int)local_38 + 0x78;
    pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar7,1);
    pcVar5 = (char *)QTest::toString(pvVar4);
    pcVar6 = (char *)QTest::toString(pvVar3);
    cVar1 = QTest::compare_helper
                      (pvVar4 == pvVar3,"Compared pointers are not the same",pcVar5,pcVar6,
                       "headers.headerForPage(1, 2)","&oddHeader",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x35);
    if (cVar1 != '\0') {
      pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar7,2);
      pcVar5 = (char *)QTest::toString(pvVar4);
      pcVar6 = (char *)QTest::toString(pvVar2);
      cVar1 = QTest::compare_helper
                        (pvVar4 == pvVar2,"Compared pointers are not the same",pcVar5,pcVar6,
                         "headers.headerForPage(2, 2)","&evenHeader",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x36);
      if (cVar1 != '\0') {
        pvVar4 = (void *)KDReports::HeaderMap::headerForPage(iVar7,1);
        pcVar5 = (char *)QTest::toString(pvVar4);
        pcVar6 = (char *)QTest::toString(pvVar3);
        cVar1 = QTest::compare_helper
                          (pvVar4 == pvVar3,"Compared pointers are not the same",pcVar5,pcVar6,
                           "headers.headerForPage(1, 1)","&oddHeader",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                           ,0x37);
        if (cVar1 != '\0') {
          pvVar3 = (void *)KDReports::HeaderMap::headerForPage(iVar7,4);
          pcVar5 = (char *)QTest::toString(pvVar3);
          pcVar6 = (char *)QTest::toString(pvVar2);
          QTest::compare_helper
                    (pvVar3 == pvVar2,"Compared pointers are not the same",pcVar5,pcVar6,
                     "headers.headerForPage(4, 4)","&evenHeader",
                     "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                     ,0x38);
        }
      }
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testEvenOdd()
    {
        Report report;
        Header &evenHeader = report.header(EvenPages);
        Header &oddHeader = report.header(OddPages);
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(!headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), &oddHeader);
        QCOMPARE(headers.headerForPage(2, 2), &evenHeader);
        QCOMPARE(headers.headerForPage(1, 1), &oddHeader);
        QCOMPARE(headers.headerForPage(4, 4), &evenHeader);
    }